

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLogger.cpp
# Opt level: O1

double __thiscall irr::CLogger::log(CLogger *this,double __x)

{
  long *plVar1;
  char cVar2;
  int in_EDX;
  c8 *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  SEvent event;
  
  if ((*(int *)&(this->super_ILogger).field_0x8 <= in_EDX) &&
     ((plVar1 = *(long **)&(this->super_ILogger).field_0x10, plVar1 == (long *)0x0 ||
      (cVar2 = (**(code **)(*plVar1 + 0x10))(), __x = extraout_XMM0_Qa, cVar2 == '\0')))) {
    os::Printer::print(in_RSI,ELL_INFORMATION);
    __x = extraout_XMM0_Qa_00;
  }
  return __x;
}

Assistant:

void CLogger::log(const c8 *text, ELOG_LEVEL ll)
{
	if (ll < LogLevel)
		return;

	if (Receiver) {
		SEvent event;
		event.EventType = EET_LOG_TEXT_EVENT;
		event.LogEvent.Text = text;
		event.LogEvent.Level = ll;
		if (Receiver->OnEvent(event))
			return;
	}

	os::Printer::print(text);
}